

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O3

float If_ManDelayMax(If_Man_t *p,int fSeq)

{
  If_Par_t *pIVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  pIVar1 = p->pPars;
  if (pIVar1->fLatchPaths == 0) {
LAB_0043707c:
    if (fSeq == 0) {
      lVar2 = (long)p->vCos->nSize;
      if (lVar2 < 1) {
        return -1e+20;
      }
      lVar5 = 0;
      fVar8 = -1e+20;
      do {
        fVar7 = *(float *)(*(long *)((long)p->vCos->pArray[lVar5] + 0x18) + 0x5c);
        if (fVar7 <= fVar8) {
          fVar7 = fVar8;
        }
        lVar5 = lVar5 + 1;
        fVar8 = fVar7;
      } while (lVar2 != lVar5);
      return fVar7;
    }
  }
  else {
    if ((pIVar1->nLatchesCi == 0) || (pIVar1->nLatchesCo == 0)) {
      Abc_Print((int)p,
                "Delay optimization of latch path is not performed because there is no latches.\n");
      pIVar1 = p->pPars;
      pIVar1->fLatchPaths = 0;
      goto LAB_0043707c;
    }
    if (fSeq == 0) {
      uVar3 = p->nObjs[3] - pIVar1->nLatchesCo;
      iVar4 = p->vCos->nSize;
      if (iVar4 <= (int)uVar3) {
        return -1e+20;
      }
      uVar6 = (ulong)uVar3;
      fVar8 = -1e+20;
      while (-1 < (int)uVar3) {
        fVar7 = *(float *)(*(long *)((long)p->vCos->pArray[uVar6] + 0x18) + 0x5c);
        if (fVar7 <= fVar8) {
          fVar7 = fVar8;
        }
        uVar6 = uVar6 + 1;
        fVar8 = fVar7;
        if (iVar4 <= (int)uVar6) {
          return fVar7;
        }
      }
      goto LAB_00437121;
    }
  }
  if (pIVar1->nLatchesCi < 1) {
    __assert_fail("p->pPars->nLatchesCi > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                  ,0x114,"float If_ManDelayMax(If_Man_t *, int)");
  }
  uVar3 = pIVar1->nLatchesCoBox;
  uVar6 = (ulong)uVar3;
  iVar4 = p->nObjs[3] - pIVar1->nLatchesCo;
  if (iVar4 <= (int)uVar3) {
    return -1e+20;
  }
  fVar8 = -1e+20;
  while ((-1 < (int)uVar3 && ((int)uVar6 < p->vCos->nSize))) {
    fVar7 = *(float *)(*(long *)((long)p->vCos->pArray[uVar6] + 0x18) + 0x5c);
    if (fVar7 <= fVar8) {
      fVar7 = fVar8;
    }
    uVar6 = uVar6 + 1;
    fVar8 = fVar7;
    if (iVar4 <= (int)uVar6) {
      return fVar7;
    }
  }
LAB_00437121:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

float If_ManDelayMax( If_Man_t * p, int fSeq )
{
    If_Obj_t * pObj;
    float DelayBest;
    int i;
    if ( p->pPars->fLatchPaths && (p->pPars->nLatchesCi == 0 || p->pPars->nLatchesCo == 0) )
    {
        Abc_Print( 0, "Delay optimization of latch path is not performed because there is no latches.\n" );
        p->pPars->fLatchPaths = 0;
    }
    DelayBest = -IF_FLOAT_LARGE;
    if ( fSeq )
    {
        assert( p->pPars->nLatchesCi > 0 );
        If_ManForEachPo( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    else if ( p->pPars->fLatchPaths )
    {
        If_ManForEachLatchInput( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    else 
    {
        If_ManForEachCo( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    return DelayBest;
}